

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureArrayPrototypeEntriesFunction(JavascriptLibrary *this)

{
  Type *addr;
  bool bVar1;
  RuntimeFunction *pRVar2;
  
  addr = &(this->super_JavascriptLibraryBase).arrayPrototypeEntriesFunction;
  if ((this->super_JavascriptLibraryBase).arrayPrototypeEntriesFunction.ptr ==
      (JavascriptFunction *)0x0) {
    bVar1 = ScriptContext::IsJsBuiltInEnabled((this->super_JavascriptLibraryBase).scriptContext.ptr)
    ;
    if (bVar1) {
      EnsureBuiltInEngineIsReady
                (Array_prototype,(this->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    else {
      pRVar2 = DefaultCreateFunction
                         (this,(FunctionInfo *)JavascriptArray::EntryInfo::Entries,0,
                          (DynamicObject *)0x0,(DynamicType *)0x0,0x7a);
      Memory::Recycler::WBSetBit((char *)addr);
      (this->super_JavascriptLibraryBase).arrayPrototypeEntriesFunction.ptr =
           &pRVar2->super_JavascriptFunction;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    }
  }
  return addr->ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureArrayPrototypeEntriesFunction()
    {
        if (arrayPrototypeEntriesFunction == nullptr)
        {
#ifndef ENABLE_JS_BUILTINS
            arrayPrototypeEntriesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Entries, 0, nullptr, nullptr, PropertyIds::entries);
#else
            if (!scriptContext->IsJsBuiltInEnabled())
            {
                arrayPrototypeEntriesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Entries, 0, nullptr, nullptr, PropertyIds::entries);
            }
            else
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
            }
#endif
        }
        return arrayPrototypeEntriesFunction;
    }